

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PriceSyncTest_TestNotEqualsDifferent_Test::TestBody
          (PriceSyncTest_TestNotEqualsDifferent_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  AssertHelper local_90;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78 [7];
  
  PriceSyncTest::createBuffer((PriceSyncTest *)&stack0xffffffffffffffc0);
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)&stack0xffffffffffffffc0,'\x01');
  bidfx_public_api::price::pixie::PriceSync::PriceSync
            ((PriceSync *)local_78,(ByteBuffer *)&stack0xffffffffffffffc0,
             (this->super_PriceSyncTest).buffer_inflator.
             super___shared_ptr<bidfx_public_api::tools::BufferInflator,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::PriceSync,bidfx_public_api::price::pixie::PriceSync>
            (local_88,"price_sync","PriceSync(buffer, *buffer_inflator)",
             &(this->super_PriceSyncTest).price_sync,(PriceSync *)local_78);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_sync_test.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_78[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78[0].ptr_ + 8))();
      }
      local_78[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

TEST_F(PriceSyncTest, TestNotEqualsDifferent)
{
    ByteBuffer buffer = createBuffer();
    buffer.SetByte(1, 33);
    EXPECT_NE(price_sync, PriceSync(buffer, *buffer_inflator));
}